

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opbehavior.cc
# Opt level: O0

uintb __thiscall
OpBehaviorIntSlessEqual::evaluateBinary
          (OpBehaviorIntSlessEqual *this,int4 sizeout,int4 sizein,uintb in1,uintb in2)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uintb bit2;
  uintb bit1;
  uintb mask;
  uintb res;
  uintb in2_local;
  uintb in1_local;
  int4 sizein_local;
  int4 sizeout_local;
  OpBehaviorIntSlessEqual *this_local;
  
  if (sizein < 1) {
    mask = 0;
  }
  else {
    uVar1 = 0x80L << (((char)sizein + -1) * '\b' & 0x3fU);
    uVar2 = in1 & uVar1;
    if (uVar2 == (in2 & uVar1)) {
      bVar3 = in1 <= in2;
    }
    else {
      bVar3 = uVar2 != 0;
    }
    mask = (uintb)(int)(uint)bVar3;
  }
  return mask;
}

Assistant:

uintb OpBehaviorIntSlessEqual::evaluateBinary(int4 sizeout,int4 sizein,uintb in1,uintb in2) const

{
  uintb res,mask,bit1,bit2;

  if (sizein<=0)
    res = 0;
  else {
    mask = 0x80;
    mask <<= 8*(sizein-1);
    bit1 = in1 & mask;		// Get the sign bits
    bit2 = in2 & mask;
    if (bit1 != bit2)
      res = (bit1 != 0) ? 1 : 0;
    else
      res = (in1 <= in2) ? 1 : 0;
  }
  return res;
}